

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O2

void __thiscall mathCore::recursive_idempotent(mathCore *this,expression *a)

{
  iterator iVar1;
  iterator __position;
  expression *a_00;
  expression *child;
  expSet tempSet;
  expression *local_68;
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  local_60;
  
  idempotent_law(this,a);
  universal_bound((expression *)this);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  __position._M_node = *(_Base_ptr *)(this + 0x20);
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (__position._M_node != (_Base_ptr)(this + 0x10)) {
    local_68 = *(expression **)(__position._M_node + 1);
    iVar1 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)(this + 8),__position._M_node);
    recursive_idempotent((mathCore *)local_68,(expression *)__position._M_node);
    std::
    _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
    ::_M_insert_equal<expression*const&>
              ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                *)&local_60,&local_68);
    __position = iVar1;
  }
  a_00 = (expression *)&local_60;
  mergeMultiSet((expSet *)(this + 8),(expSet *)a_00);
  idempotent_law(this,a_00);
  universal_bound((expression *)this);
  std::
  _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void mathCore::recursive_idempotent(expression* a) {
	mathCore::idempotent_law(a);
	mathCore::universal_bound(a);

	// We simplify first, because it might help stop recursion

	expSet tempSet;
	expression* child;
	auto iter = a->contents.begin();

	
	while (iter != a->contents.end()) {
		child = *iter;
		iter = a->contents.erase(iter);

		recursive_idempotent(child);
		tempSet.insert(child);
	}

	mergeMultiSet(a->contents, tempSet);

	mathCore::idempotent_law(a);
	mathCore::universal_bound(a);

	// We simplify After, because one of our children might have changed!
}